

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O3

void gray_rgb_convert(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
                     JSAMPARRAY output_buf,int num_rows)

{
  JSAMPLE JVar1;
  uint uVar2;
  JSAMPROW pJVar3;
  bool bVar4;
  JSAMPROW pJVar5;
  ulong uVar6;
  
  switch(cinfo->out_color_space) {
  case JCS_EXT_RGB:
    if (0 < num_rows) {
      uVar2 = cinfo->output_width;
      do {
        if ((ulong)uVar2 != 0) {
          pJVar3 = (*input_buf)[input_row];
          pJVar5 = *output_buf + 2;
          uVar6 = 0;
          do {
            JVar1 = pJVar3[uVar6];
            *pJVar5 = JVar1;
            pJVar5[-1] = JVar1;
            pJVar5[-2] = JVar1;
            uVar6 = uVar6 + 1;
            pJVar5 = pJVar5 + 3;
          } while (uVar2 != uVar6);
        }
        input_row = input_row + 1;
        output_buf = output_buf + 1;
        bVar4 = 1 < num_rows;
        num_rows = num_rows + -1;
      } while (bVar4);
    }
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    if (0 < num_rows) {
      uVar2 = cinfo->output_width;
      do {
        if ((ulong)uVar2 != 0) {
          pJVar3 = (*input_buf)[input_row];
          pJVar5 = *output_buf;
          uVar6 = 0;
          do {
            JVar1 = pJVar3[uVar6];
            pJVar5[uVar6 * 4 + 2] = JVar1;
            pJVar5[uVar6 * 4 + 1] = JVar1;
            pJVar5[uVar6 * 4] = JVar1;
            pJVar5[uVar6 * 4 + 3] = 0xff;
            uVar6 = uVar6 + 1;
          } while (uVar2 != uVar6);
        }
        input_row = input_row + 1;
        output_buf = output_buf + 1;
        bVar4 = 1 < num_rows;
        num_rows = num_rows + -1;
      } while (bVar4);
    }
    break;
  case JCS_EXT_BGR:
    if (0 < num_rows) {
      uVar2 = cinfo->output_width;
      do {
        if ((ulong)uVar2 != 0) {
          pJVar3 = (*input_buf)[input_row];
          pJVar5 = *output_buf;
          uVar6 = 0;
          do {
            JVar1 = pJVar3[uVar6];
            *pJVar5 = JVar1;
            pJVar5[1] = JVar1;
            pJVar5[2] = JVar1;
            pJVar5 = pJVar5 + 3;
            uVar6 = uVar6 + 1;
          } while (uVar2 != uVar6);
        }
        input_row = input_row + 1;
        output_buf = output_buf + 1;
        bVar4 = 1 < num_rows;
        num_rows = num_rows + -1;
      } while (bVar4);
    }
    break;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    if (0 < num_rows) {
      uVar2 = cinfo->output_width;
      do {
        if ((ulong)uVar2 != 0) {
          pJVar3 = (*input_buf)[input_row];
          pJVar5 = *output_buf;
          uVar6 = 0;
          do {
            JVar1 = pJVar3[uVar6];
            pJVar5[uVar6 * 4] = JVar1;
            pJVar5[uVar6 * 4 + 1] = JVar1;
            pJVar5[uVar6 * 4 + 2] = JVar1;
            pJVar5[uVar6 * 4 + 3] = 0xff;
            uVar6 = uVar6 + 1;
          } while (uVar2 != uVar6);
        }
        input_row = input_row + 1;
        output_buf = output_buf + 1;
        bVar4 = 1 < num_rows;
        num_rows = num_rows + -1;
      } while (bVar4);
    }
    break;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    if (0 < num_rows) {
      uVar2 = cinfo->output_width;
      do {
        if ((ulong)uVar2 != 0) {
          pJVar3 = (*input_buf)[input_row];
          pJVar5 = *output_buf;
          uVar6 = 0;
          do {
            JVar1 = pJVar3[uVar6];
            pJVar5[uVar6 * 4 + 1] = JVar1;
            pJVar5[uVar6 * 4 + 2] = JVar1;
            pJVar5[uVar6 * 4 + 3] = JVar1;
            pJVar5[uVar6 * 4] = 0xff;
            uVar6 = uVar6 + 1;
          } while (uVar2 != uVar6);
        }
        input_row = input_row + 1;
        output_buf = output_buf + 1;
        bVar4 = 1 < num_rows;
        num_rows = num_rows + -1;
      } while (bVar4);
    }
    break;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    if (0 < num_rows) {
      uVar2 = cinfo->output_width;
      do {
        if ((ulong)uVar2 != 0) {
          pJVar3 = (*input_buf)[input_row];
          pJVar5 = *output_buf;
          uVar6 = 0;
          do {
            JVar1 = pJVar3[uVar6];
            pJVar5[uVar6 * 4 + 3] = JVar1;
            pJVar5[uVar6 * 4 + 2] = JVar1;
            pJVar5[uVar6 * 4 + 1] = JVar1;
            pJVar5[uVar6 * 4] = 0xff;
            uVar6 = uVar6 + 1;
          } while (uVar2 != uVar6);
        }
        input_row = input_row + 1;
        output_buf = output_buf + 1;
        bVar4 = 1 < num_rows;
        num_rows = num_rows + -1;
      } while (bVar4);
    }
    break;
  default:
    if (0 < num_rows) {
      uVar2 = cinfo->output_width;
      do {
        if ((ulong)uVar2 != 0) {
          pJVar3 = (*input_buf)[input_row];
          pJVar5 = *output_buf + 2;
          uVar6 = 0;
          do {
            JVar1 = pJVar3[uVar6];
            *pJVar5 = JVar1;
            pJVar5[-1] = JVar1;
            pJVar5[-2] = JVar1;
            uVar6 = uVar6 + 1;
            pJVar5 = pJVar5 + 3;
          } while (uVar2 != uVar6);
        }
        input_row = input_row + 1;
        output_buf = output_buf + 1;
        bVar4 = 1 < num_rows;
        num_rows = num_rows + -1;
      } while (bVar4);
    }
  }
  return;
}

Assistant:

METHODDEF(void)
gray_rgb_convert(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                 JDIMENSION input_row, JSAMPARRAY output_buf, int num_rows)
{
  switch (cinfo->out_color_space) {
  case JCS_EXT_RGB:
    gray_extrgb_convert_internal(cinfo, input_buf, input_row, output_buf,
                                 num_rows);
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    gray_extrgbx_convert_internal(cinfo, input_buf, input_row, output_buf,
                                  num_rows);
    break;
  case JCS_EXT_BGR:
    gray_extbgr_convert_internal(cinfo, input_buf, input_row, output_buf,
                                 num_rows);
    break;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    gray_extbgrx_convert_internal(cinfo, input_buf, input_row, output_buf,
                                  num_rows);
    break;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    gray_extxbgr_convert_internal(cinfo, input_buf, input_row, output_buf,
                                  num_rows);
    break;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    gray_extxrgb_convert_internal(cinfo, input_buf, input_row, output_buf,
                                  num_rows);
    break;
  default:
    gray_rgb_convert_internal(cinfo, input_buf, input_row, output_buf,
                              num_rows);
    break;
  }
}